

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O2

void __thiscall
imrt::ACO::initializeHeuristic
          (ACO *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_intensity,
          int initial_intensity,int step_intensity)

{
  Collimator *pCVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  ApertureILS *this_00;
  ostream *poVar5;
  Plan *this_01;
  Station *this_02;
  pair<int,_int> p;
  int i;
  long lVar6;
  int r;
  long lVar7;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *pvVar8;
  double dVar9;
  int local_114;
  long local_110;
  double local_108;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *local_100;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *local_f8;
  ulong local_f0;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  mheuristic;
  Matrix local_88;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_100 = &this->iheuristic;
  local_f8 = &this->heuristic;
  lVar6 = 0;
  while( true ) {
    iVar2 = Collimator::getNbAngles(this->collimator);
    if (iVar2 <= lVar6) break;
    mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &mheuristic._M_t._M_impl.super__Rb_tree_header._M_header;
    mheuristic._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar2 = this->max_apertures;
    local_110 = lVar6;
    mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         mheuristic._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar3 = Collimator::getIntensityLevelSize(this->collimator);
    maths::Matrix::Matrix(&local_88,iVar2,iVar3);
    std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::emplace_back<maths::Matrix>
              (local_100,&local_88);
    maths::Matrix::~Matrix(&local_88);
    local_108 = (double)(local_110 << 4);
    for (local_114 = 0; local_114 < this->max_apertures; local_114 = local_114 + 1) {
      lVar6 = 0;
      while( true ) {
        iVar2 = Collimator::getIntensityLevelSize(this->collimator);
        if (iVar2 <= lVar6) break;
        *(undefined8 *)
         (*(long *)(*(long *)((long)&((local_100->
                                      super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->p +
                             (long)local_108) + (long)local_114 * 8) + lVar6 * 8) =
             0x3fe0000000000000;
        lVar6 = lVar6 + 1;
      }
      iVar2 = Collimator::getXdim(this->collimator);
      iVar3 = Collimator::getReferenceSize(this->collimator);
      maths::Matrix::Matrix(&local_88,iVar2,iVar3);
      pmVar4 = std::
               map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
               ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                             *)&mheuristic._M_t,&local_114);
      maths::Matrix::operator=(pmVar4,&local_88);
      maths::Matrix::~Matrix(&local_88);
      lVar6 = 0;
      while( true ) {
        iVar2 = Collimator::getXdim(this->collimator);
        if (iVar2 <= lVar6) break;
        lVar7 = 0;
        while( true ) {
          iVar2 = Collimator::getReferenceSize(this->collimator);
          if (iVar2 <= lVar7) break;
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                                 *)&mheuristic._M_t,&local_114);
          pmVar4->p[lVar6][lVar7] = 0.5;
          lVar7 = lVar7 + 1;
        }
        lVar6 = lVar6 + 1;
      }
    }
    std::
    vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
    ::push_back(local_f8,(value_type *)&mheuristic._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
    ::~_Rb_tree(&mheuristic._M_t);
    lVar6 = local_110 + 1;
  }
  this_00 = (ApertureILS *)operator_new(0x78);
  ApertureILS::ApertureILS(this_00,1,1,true,true,1.0,step_intensity,100.0,0.5,false,0,0,0);
  this->ils = this_00;
  poVar5 = std::operator<<((ostream *)&std::cout,"Initializing heuristic information with ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,5);
  poVar5 = std::operator<<(poVar5," ls executions");
  std::endl<char,std::char_traits<char>>(poVar5);
  local_f0 = 0;
  while( true ) {
    if ((int)local_f0 == 5) break;
    this_01 = (Plan *)operator_new(0xd0);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,w);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,Zmin);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_60,Zmax);
    Plan::Plan(this_01,(vector<double,_std::allocator<double>_> *)&local_78,
               (vector<double,_std::allocator<double>_> *)&local_48,
               (vector<double,_std::allocator<double>_> *)&local_60,this->collimator,volumes,
               this->max_apertures,max_intensity,initial_intensity,step_intensity,-1,0,(char *)0x0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    ApertureILS::simpleLocalSearch(this->ils,this_01,false);
    poVar5 = std::operator<<((ostream *)&std::cout," Local search ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)local_f0);
    std::operator<<(poVar5,": ");
    dVar9 = Plan::getEvaluation(this_01);
    poVar5 = std::ostream::_M_insert<double>(dVar9);
    std::endl<char,std::char_traits<char>>(poVar5);
    local_108 = Plan::getEvaluation(this_01);
    local_108 = 5.0 / local_108;
    pvVar8 = (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
              *)0x0;
    while( true ) {
      iVar2 = Collimator::getNbAngles(this->collimator);
      if ((long)iVar2 <= (long)pvVar8) break;
      this_02 = Plan::get_station(this_01,(int)pvVar8);
      local_110 = (long)pvVar8 << 4;
      local_f8 = pvVar8;
      for (mheuristic._M_t._M_impl._0_4_ = 0;
          (int)mheuristic._M_t._M_impl._0_4_ < this->max_apertures;
          mheuristic._M_t._M_impl._0_4_ = mheuristic._M_t._M_impl._0_4_ + 1) {
        pCVar1 = this->collimator;
        dVar9 = Station::getApertureIntensity(this_02,mheuristic._M_t._M_impl._0_4_);
        iVar2 = Collimator::getIntensityLevel(pCVar1,dVar9);
        lVar6 = *(long *)(*(long *)((long)&((this->iheuristic).
                                            super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->p +
                                   local_110) + (long)(int)mheuristic._M_t._M_impl._0_4_ * 8);
        *(double *)(lVar6 + (long)iVar2 * 8) = *(double *)(lVar6 + (long)iVar2 * 8) + local_108;
        lVar6 = 0;
        while( true ) {
          iVar2 = Collimator::getXdim(this->collimator);
          if (iVar2 <= lVar6) break;
          pCVar1 = this->collimator;
          p = Station::getApertureShape(this_02,mheuristic._M_t._M_impl._0_4_,(int)lVar6);
          iVar2 = Collimator::searchReferenceIndex(pCVar1,p);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((this->heuristic).
                                super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pvVar8,
                                (key_type_conflict *)&mheuristic);
          local_100 = (vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)
                      (pmVar4->p[lVar6][iVar2] + local_108);
          pmVar4 = std::
                   map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   ::operator[]((this->heuristic).
                                super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pvVar8,
                                (key_type_conflict *)&mheuristic);
          pmVar4->p[lVar6][iVar2] = (double)local_100;
          lVar6 = lVar6 + 1;
        }
      }
      pvVar8 = (vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                *)((long)&(local_f8->
                          super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    local_f0 = (ulong)((int)local_f0 + 1);
  }
  return;
}

Assistant:

void initializeHeuristic (vector<double> w, vector<double> Zmin, vector<double> Zmax, vector<Volume>& volumes, 
                            int max_intensity, int initial_intensity, int step_intensity) {
    int nls=5;
    //Initialize structure
    for (int s=0; s< collimator.getNbAngles();s++) {
      map<int, Matrix> mheuristic;
      iheuristic.push_back(Matrix(max_apertures,  collimator.getIntensityLevelSize()));
      for (int a=0; a< max_apertures; a++) {
        for (int i=0; i< collimator.getIntensityLevelSize(); i++){
          iheuristic[s](a,i) = 0.5;
        }
        mheuristic[a] = Matrix(collimator.getXdim(), collimator.getReferenceSize());
        for (int j = 0; j < collimator.getXdim(); j++) {
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            mheuristic[a](j,r) =0.5;
          }
        }
      }
      heuristic.push_back(mheuristic);
    }
    
    //Perform local search and generate heuristic information
    Station *st;
    int aux;
    double deposit;
    ils = new ApertureILS(1, 1, true, true, 1, step_intensity, 100, 0.5, false, 0, ILS::ACCEPT_NONE, ApertureILS::FIRST_IMPROVEMENT);
    cout << "Initializing heuristic information with " << nls << " ls executions"<< endl;
    for (int i=0 ;i < nls; i++) {
      Plan *p = new Plan(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, -1, Station::OPEN_MIN_SETUP);
      ils->simpleLocalSearch (*p, false);
      cout << " Local search "<<i<<": "<< p->getEvaluation() << endl;
      
      // Place deposit in heuristic information
      deposit = 5.0/p->getEvaluation();
      for (int s = 0; s < collimator.getNbAngles(); s++) {
        st = p->get_station(s);
        for (int a = 0; a < max_apertures; a++) {
          // Intensity heuristic 
          aux = collimator.getIntensityLevel(st->getApertureIntensity(a));
          iheuristic[s](a,aux) = iheuristic[s](a,aux) + deposit;
          // Aperture heuristic
          for (int j = 0; j < collimator.getXdim(); j++) {
            aux = collimator.searchReferenceIndex(st->getApertureShape(a, j));
            heuristic[s][a](j,aux) = heuristic[s][a](j,aux) + deposit;
          }
        }
      }
    }
  }